

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Base64.cpp
# Opt level: O0

bool Jupiter_isBase64(char *in)

{
  char cVar1;
  char *local_18;
  char *in_local;
  
  local_18 = in;
  do {
    if (*local_18 == '\0') {
      return true;
    }
    cVar1 = *local_18;
    local_18 = local_18 + 1;
  } while ("BBBBBBBBB@BBBBBBBBBBBBBBBBBBBBBBBBBBBBBBBBB>BBB?456789:;<=BBBABBB"[cVar1] != 'B');
  return false;
}

Assistant:

bool Jupiter_isBase64(const char *in)
{
	while (*in != 0)
	{
		switch (Jupiter_base64DecodeTable[*in++])
		{
		case 66:
			return false;
		default:
			break;
		}
	}
	return true;
}